

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O0

void nn_streamhdr_start(nn_streamhdr *self,nn_usock *usock,nn_pipebase *pipebase)

{
  char *pcVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int protocol;
  size_t sz;
  uint3 in_stack_ffffffffffffffd8;
  uint uVar2;
  uint16_t val;
  undefined4 in_stack_ffffffffffffffdc;
  nn_usock *in_stack_ffffffffffffffe0;
  long lVar3;
  
  uVar2 = (uint)in_stack_ffffffffffffffd8;
  if (*(long *)(in_RDI + 0x148) == 0) {
    uVar2 = CONCAT13(*(long *)(in_RDI + 0x158) == 0,in_stack_ffffffffffffffd8);
  }
  if ((((byte)(uVar2 >> 0x18) ^ 0xff) & 1) != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "self->usock == NULL && self->usock_owner.fsm == NULL",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
            ,0x5a);
    fflush(_stderr);
    nn_err_abort();
  }
  *(undefined4 *)(in_RDI + 0x150) = 1;
  *(long *)(in_RDI + 0x158) = in_RDI;
  nn_usock_swap_owner(in_stack_ffffffffffffffe0,
                      (nn_fsm_owner *)CONCAT44(in_stack_ffffffffffffffdc,uVar2));
  val = (uint16_t)in_stack_ffffffffffffffdc;
  *(undefined8 *)(in_RDI + 0x148) = in_RSI;
  *(undefined8 *)(in_RDI + 0x160) = in_RDX;
  lVar3 = 4;
  nn_pipebase_getopt((nn_pipebase *)self,usock._4_4_,(int)usock,pipebase,(size_t *)sz);
  if (lVar3 != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (protocol)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/utils/streamhdr.c"
            ,100);
    fflush(_stderr);
    nn_err_abort();
  }
  pcVar1 = (char *)(in_RDI + 0x168);
  pcVar1[0] = '\0';
  pcVar1[1] = 'S';
  pcVar1[2] = 'P';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  nn_puts((uint8_t *)(in_RDI + 0x16c),val);
  nn_fsm_start((nn_fsm *)0x17f06a);
  return;
}

Assistant:

void nn_streamhdr_start (struct nn_streamhdr *self, struct nn_usock *usock,
    struct nn_pipebase *pipebase)
{
    size_t sz;
    int protocol;

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_STREAMHDR_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;

    /*  Get the protocol identifier. */
    sz = sizeof (protocol);
    nn_pipebase_getopt (pipebase, NN_SOL_SOCKET, NN_PROTOCOL, &protocol, &sz);
    nn_assert (sz == sizeof (protocol));

    /*  Compose the protocol header. */
    memcpy (self->protohdr, "\0SP\0\0\0\0\0", 8);
    nn_puts (self->protohdr + 4, (uint16_t) protocol);

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}